

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

uint64_t art_allocate_index(art_t *art,art_typecode_t typecode)

{
  uint64_t uVar1;
  uint64_t uVar2;
  byte in_SIL;
  art_t *in_RDI;
  art_t *unaff_retaddr;
  uint64_t first_free;
  undefined8 in_stack_fffffffffffffff8;
  
  uVar1 = in_RDI->first_free[in_SIL];
  if (uVar1 == in_RDI->capacities[in_SIL]) {
    art_extend(unaff_retaddr,(art_typecode_t)((ulong)in_stack_fffffffffffffff8 >> 0x38));
    in_RDI->first_free[in_SIL] = in_RDI->first_free[in_SIL] + 1;
  }
  else {
    uVar2 = art_next_free(in_RDI,in_SIL);
    in_RDI->first_free[in_SIL] = uVar2;
  }
  return uVar1;
}

Assistant:

static uint64_t art_allocate_index(art_t *art, art_typecode_t typecode) {
    uint64_t first_free = art->first_free[typecode];
    if (first_free == art->capacities[typecode]) {
        art_extend(art, typecode);
        art->first_free[typecode]++;
        return first_free;
    }
    art->first_free[typecode] = art_next_free(art, typecode);
    return first_free;
}